

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O2

int32_t __thiscall
cornelich::cycle_formatter_yyyymmdd::cycle_from_date_impl
          (cycle_formatter_yyyymmdd *this,string *date)

{
  bool bVar1;
  int64_t iVar2;
  int32_t iVar3;
  long *in_FS_OFFSET;
  time_point ts;
  
  iVar3 = -1;
  if (date->_M_string_length == 8) {
    bVar1 = parse_date(date,(day_point *)(*in_FS_OFFSET + -0x14));
    if (bVar1) {
      ts.__d.__r = (duration)((long)*(int *)((long)in_FS_OFFSET + -0x14) * 86400000000000);
      iVar2 = get_epoch_seconds(&ts);
      iVar3 = (int32_t)((iVar2 * 1000) / (long)(this->super_cycle_formatter).m_cycle_length);
    }
  }
  return iVar3;
}

Assistant:

std::int32_t cycle_formatter_yyyymmdd::cycle_from_date_impl(const std::string & date) const
{
    thread_local day_point dp;
    if(BOOST_UNLIKELY(date.length() != 8))
        return -1;
    if(BOOST_UNLIKELY(!parse_date(date, dp)))
        return -1;
    system_clock::time_point ts = dp;
    auto unix_timestamp = get_epoch_seconds(ts);

    return unix_timestamp * 1000 / m_cycle_length;
}